

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall
QWizardField::findProperty(QWizardField *this,QWizardDefaultProperty *properties,int propertyCount)

{
  bool bVar1;
  undefined8 *puVar2;
  ulong uVar3;
  QWizardDefaultProperty *rhs;
  ulong uVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  uVar4 = 0;
  uVar3 = (ulong)(uint)propertyCount;
  if (propertyCount < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar4 == uVar3) {
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    rhs = properties + uVar4;
    for (puVar2 = (undefined8 *)(*(code *)**(undefined8 **)this->object)();
        puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2) {
      local_40 = (char *)QMetaObject::className();
      bVar1 = ::operator==(&local_40,&rhs->className);
      if (bVar1) {
        QByteArray::operator=((QByteArray *)&local_58,&rhs->className);
        QByteArray::operator=(&this->property,&rhs->property);
        QByteArray::operator=(&this->changedSignal,&rhs->changedSignal);
        break;
      }
      local_40 = (char *)QMetaObject::className();
      bVar1 = ::operator==(&local_40,(QByteArray *)&local_58);
      if (bVar1) break;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void QWizardField::findProperty(const QWizardDefaultProperty *properties, int propertyCount)
{
    QByteArray className;

    for (int i = 0; i < propertyCount; ++i) {
        if (objectInheritsXAndXIsCloserThanY(object, properties[i].className, className)) {
            className = properties[i].className;
            property = properties[i].property;
            changedSignal = properties[i].changedSignal;
        }
    }
}